

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.c
# Opt level: O3

void DFS_classify(Graph *g,GraphNode *n,classifier_state *state)

{
  uint32_t uVar1;
  GraphNodeLink *pGVar2;
  GraphNode *n_00;
  ulong uVar3;
  
  if (n != (GraphNode *)0x0) {
    uVar1 = state->preorder;
    n->pre = uVar1;
    state->preorder = uVar1 + 1;
    if (*(short *)&n->succs != 0) {
      uVar3 = 0;
      do {
        pGVar2 = (n->succs).links;
        n_00 = g->nodes[pGVar2[uVar3].node_index];
        if (n_00->pre == 0) {
          pGVar2[uVar3].edge_type = '\x01';
          DFS_classify(g,n_00,state);
        }
        else if (n_00->rpost == 0) {
          pGVar2[uVar3].edge_type = '\x02';
        }
        else if (n->pre < n_00->pre) {
          pGVar2[uVar3].edge_type = '\x04';
        }
        else {
          pGVar2[uVar3].edge_type = '\b';
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < *(ushort *)&n->succs);
    }
    uVar1 = state->rpostorder;
    n->rpost = uVar1;
    state->rpostorder = uVar1 - 1;
    return;
  }
  __assert_fail("n",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/graph.c"
                ,0x138,"void DFS_classify(Graph *, GraphNode *, struct classifier_state *)");
}

Assistant:

static void DFS_classify(Graph *g, GraphNode *n, struct classifier_state *state)
{
	assert(n);

	n->pre = state->preorder;
	state->preorder++;

	/* For each successor node */
	for (unsigned i = 0; i < n->succs.count; i++) {
		struct GraphNodeLink *E = &n->succs.links[i];
		GraphNode *S = g->nodes[E->node_index];
		if (S->pre == 0) {
			E->edge_type = EDGE_TYPE_TREE;
			DFS_classify(g, S, state);
		} else if (S->rpost == 0) {
			E->edge_type = EDGE_TYPE_BACKWARD;
		} else if (n->pre < S->pre) {
			E->edge_type = EDGE_TYPE_FORWARD;
		} else {
			E->edge_type = EDGE_TYPE_CROSS;
		}
	}

	n->rpost = state->rpostorder;
	state->rpostorder--;
}